

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

void VW::read_line_decision_service_json<true>
               (vw *all,v_array<example_*> *examples,char *line,size_t length,bool copy_line,
               example_factory_t example_factory,void *ex_factory_context,
               DecisionServiceInteraction *data)

{
  BaseState<true> *pBVar1;
  ostream *poVar2;
  char *pcVar3;
  vw_exception *this;
  undefined3 in_register_00000081;
  ParseResult PVar4;
  vector<char,_std::allocator<char>_> line_vec;
  InsituStringStream ss;
  string local_418 [32];
  string local_3f8;
  json_parser<true> parser;
  stringstream __msg;
  ostream local_1a8;
  
  line_vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  line_vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  line_vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (CONCAT31(in_register_00000081,copy_line) != 0) {
    std::vector<char,std::allocator<char>>::insert<char*,void>
              ((vector<char,std::allocator<char>> *)&line_vec,(const_iterator)0x0,line,line + length
              );
    line = line_vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  }
  ss.dst_ = (Ch *)0x0;
  ss.src_ = line;
  ss.head_ = line;
  json_parser<true>::json_parser(&parser);
  parser.handler.ctx.key = " ";
  parser.handler.ctx.key_length = 1;
  parser.handler.ctx.previous_state = (BaseState<true> *)0x0;
  parser.handler.ctx.label_object_state.found = false;
  parser.handler.ctx.label_object_state.found_cb = false;
  parser.handler.ctx.label_object_state.cb_label.cost = 0.0;
  parser.handler.ctx.label_object_state.cb_label.action = 0;
  parser.handler.ctx.label_object_state.cb_label.probability = 0.0;
  parser.handler.ctx.label_object_state.cb_label.partial_prediction = 0.0;
  parser.handler.ctx.ex = *examples->_begin;
  parser.handler.ctx.all = all;
  parser.handler.ctx.examples = examples;
  (*(all->p->lp).default_label)(&(parser.handler.ctx.ex)->l);
  parser.handler.ctx.stream_end = line + length;
  parser.handler.ctx.stream = &ss;
  parser.handler.ctx.example_factory_context = ex_factory_context;
  parser.handler.ctx.current_state =
       &parser.handler.ctx.decision_service_state.super_BaseState<true>;
  parser.handler.ctx.decision_service_state.data = data;
  parser.handler.ctx.example_factory = example_factory;
  parser.handler.ctx.root_state = parser.handler.ctx.current_state;
  PVar4 = rapidjson::
          GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
          Parse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                    ((GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                      *)&parser,parser.handler.ctx.stream,&parser.handler);
  pBVar1 = parser.handler.ctx.current_state;
  if (PVar4.code_ == kParseErrorNone) {
    json_parser<true>::~json_parser(&parser);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&line_vec.super__Vector_base<char,_std::allocator<char>_>);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  poVar2 = std::operator<<(&local_1a8,"JSON parser error at ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,": ");
  pcVar3 = rapidjson::GetParseError_En(PVar4.code_);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,". Handler: ");
  Context<true>::error_abi_cxx11_(&parser.handler.ctx);
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<(poVar2,local_418);
  poVar2 = std::operator<<(poVar2,"State: ");
  if (pBVar1 == (BaseState<true> *)0x0) {
    pcVar3 = "null";
  }
  else {
    pcVar3 = pBVar1->name;
  }
  std::operator<<(poVar2,pcVar3);
  std::__cxx11::string::~string(local_418);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_example_json.h"
             ,0x488,&local_3f8);
  __cxa_throw(this,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void read_line_decision_service_json(vw& all, v_array<example*>& examples, char* line, size_t length, bool copy_line,
    example_factory_t example_factory, void* ex_factory_context, DecisionServiceInteraction* data)
{
  std::vector<char> line_vec;
  if (copy_line)
  {
    line_vec.insert(line_vec.end(), line, line + length);
    line = &line_vec.front();
  }

  InsituStringStream ss(line);
  json_parser<audit> parser;

  VWReaderHandler<audit>& handler = parser.handler;
  handler.init(&all, &examples, &ss, line + length, example_factory, ex_factory_context);
  handler.ctx.SetStartStateToDecisionService(data);

  ParseResult result =
      parser.reader.template Parse<kParseInsituFlag, InsituStringStream, VWReaderHandler<audit>>(ss, handler);

  if (!result.IsError())
    return;

  BaseState<audit>* current_state = handler.current_state();

  THROW("JSON parser error at " << result.Offset() << ": " << GetParseError_En(result.Code())
                                << ". "
                                   "Handler: "
                                << handler.error().str()
                                << "State: " << (current_state ? current_state->name : "null"));
}